

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

void __thiscall curlpp::HttpPost::clear(HttpPost *this)

{
  list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  *in_RDI;
  
  if ((in_RDI->
      super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
      )._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
    curl_formfree((in_RDI->
                  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next);
    (in_RDI->
    super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    (in_RDI->
    super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  }
  std::__cxx11::
  list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ::clear(in_RDI);
  return;
}

Assistant:

void
curlpp::HttpPost::clear()
{
  if(mFirst != NULL) {
    ::curl_formfree(mFirst);
    mFirst = NULL;
    mLast = NULL;
  }
  
  mForms.clear();
}